

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestNoTailForwarder::hold(TestNoTailForwarder *this,HoldContext context)

{
  Coroutine<void> *this_00;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  *this_01;
  PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
  *__return_storage_ptr__;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  *this_02;
  PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
  *__return_storage_ptr___00;
  long *plVar1;
  long lVar2;
  SegmentBuilder *pSVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long *plVar6;
  SourceLocation location;
  bool bVar7;
  undefined4 uVar8;
  coroutine_handle<void> coroutine;
  CapTableReader *__n;
  undefined8 uVar9;
  undefined8 *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  undefined8 uVar10;
  void *__buf_00;
  int __flags;
  SegmentReader *pSVar11;
  undefined8 uVar12;
  Own<capnp::ClientHook,_std::nullptr_t> OVar13;
  undefined1 local_68 [16];
  long *local_58;
  WirePointer *local_50;
  StructPointerCount local_44;
  int local_40;
  CallContextHook *local_38;
  
  coroutine._M_fr_ptr = operator_new(0x8c0);
  *(code **)coroutine._M_fr_ptr = hold;
  *(code **)((long)coroutine._M_fr_ptr + 8) = hold;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(CallContextHook **)((long)coroutine._M_fr_ptr + 0x8b0) = context.hook;
  local_68._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  local_68._8_8_ = "hold";
  local_58 = (long *)0x1500000854;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006e78f0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006e7938;
  location.function = "hold";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  location.lineNumber = 0x854;
  location.columnNumber = 0x15;
  local_38 = context.hook;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006e78f0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006e7938;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  *(Coroutine<void> **)&this->super_Server = this_00;
  (**(code **)*in_RDX)((undefined8 *)((long)coroutine._M_fr_ptr + 0x7d8));
  uVar12 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7e0);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7c8) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7e8);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 2000) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7f0);
  ((PointerReader *)((long)coroutine._M_fr_ptr + 0x7b8))->segment =
       *(SegmentReader **)((long)coroutine._M_fr_ptr + 0x7d8);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7c0) = uVar12;
  PointerReader::getStruct
            ((StructReader *)local_68,(PointerReader *)((long)coroutine._M_fr_ptr + 0x7b8),
             (word *)0x0);
  __n = (CapTableReader *)local_68._8_8_;
  pSVar11 = (SegmentReader *)local_68._0_8_;
  if (local_44 == 0) {
    local_40 = 0x7fffffff;
    local_50 = (WirePointer *)0x0;
    __n = (CapTableReader *)0x0;
    pSVar11 = (SegmentReader *)0x0;
  }
  *(SegmentReader **)((long)coroutine._M_fr_ptr + 0x798) = pSVar11;
  *(CapTableReader **)((long)coroutine._M_fr_ptr + 0x7a0) = __n;
  *(WirePointer **)((long)coroutine._M_fr_ptr + 0x7a8) = local_50;
  *(int *)((long)coroutine._M_fr_ptr + 0x7b0) = local_40;
  PointerReader::getCapability((PointerReader *)((long)coroutine._M_fr_ptr + 0x870));
  __flags = (int)pSVar11;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x848) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x870);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x850) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x878);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x878) = 0;
  *(pointer_____offset_0x10___ **)((long)coroutine._M_fr_ptr + 0x840) =
       &Capability::Client::typeinfo;
  if (*(char *)&local_38[4]._vptr_CallContextHook == '\x01') {
    (((Maybe<capnp::MessageSize> *)((long)coroutine._M_fr_ptr + 0x828))->ptr).isSet = false;
    capnproto_test::capnp::test::TestMoreStuff::Client::echoRequest
              ((Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
                *)((long)coroutine._M_fr_ptr + 0x6e0),(Client *)(local_38 + 5),
               (Maybe<capnp::MessageSize> *)((long)coroutine._M_fr_ptr + 0x828));
    (**(code **)(**(long **)((long)coroutine._M_fr_ptr +
                            *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x840) + -0x18) + 0x848)
                + 0x20))((long)coroutine._M_fr_ptr + 0x880);
    local_68._8_8_ = *(size_t *)((long)coroutine._M_fr_ptr + 0x880);
    local_58 = *(long **)((long)coroutine._M_fr_ptr + 0x888);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x888) = 0;
    local_68._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x858) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6e0);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x860) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6e8);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x868) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6f8);
    PointerBuilder::setCapability
              ((PointerBuilder *)((long)coroutine._M_fr_ptr + 0x858),
               (Own<capnp::ClientHook,_std::nullptr_t> *)(local_68 + 8));
    plVar1 = local_58;
    __buf = extraout_RDX;
    if (local_58 != (long *)0x0) {
      local_58 = (long *)0x0;
      (***(_func_int ***)local_68._8_8_)(local_68._8_8_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
      __buf = extraout_RDX_00;
    }
    this_01 = (Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
               *)((long)coroutine._M_fr_ptr + 0x748);
    Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
    ::send(this_01,(int)(Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
                         *)((long)coroutine._M_fr_ptr + 0x6e0),__buf,(size_t)__n,__flags);
    __return_storage_ptr__ =
         (PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
          *)((long)coroutine._M_fr_ptr + 0x430);
    co_await<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>>
              (__return_storage_ptr__,
               (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_> *
               )this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x8b8) = 0;
    bVar7 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar7) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
    ::await_resume((Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *)
                   ((long)coroutine._M_fr_ptr + 0x668),__return_storage_ptr__);
    if ((*(char *)((long)coroutine._M_fr_ptr + 0x5e0) == '\x01') &&
       (plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x620), plVar1 != (long *)0x0)) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x620) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x618))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x618),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x448) == '\x01') {
      kj::Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x450));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    lVar2 = *(long *)((long)coroutine._M_fr_ptr + 0x760);
    if (lVar2 != 0) {
      uVar12 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x768);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x760) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x768) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x770))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x770),lVar2,8,uVar12,uVar12,0);
    }
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x758);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x758) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x750))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x750),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    pSVar3 = (this_01->super_Builder)._builder.segment;
    if (pSVar3 != (SegmentBuilder *)0x0) {
      (this_01->super_Builder)._builder.segment = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar3);
    }
    if (*(short *)((long)coroutine._M_fr_ptr + 0x68c) == 0) {
      uVar8 = 0x7fffffff;
      uVar9 = 0;
      uVar10 = 0;
      uVar12 = 0;
    }
    else {
      uVar12 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x668);
      uVar9 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x670);
      uVar10 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x680);
      uVar8 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x690);
    }
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x778) = uVar12;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x780) = uVar9;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x788) = uVar10;
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x790) = uVar8;
    OVar13 = PointerReader::getCapability((PointerReader *)((long)coroutine._M_fr_ptr + 0x890));
    __flags = (int)uVar12;
    puVar4 = *(undefined8 **)((long)coroutine._M_fr_ptr + 0x890);
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x898);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x898) = 0;
    (**(code **)(*plVar1 + 0x20))((long)coroutine._M_fr_ptr + 0x8a0,plVar1,OVar13.ptr);
    __n = *(CapTableReader **)((long)coroutine._M_fr_ptr + 0x8a0);
    uVar12 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x8a8);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x8a8) = 0;
    lVar2 = *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x840) + -0x18);
    puVar5 = *(undefined8 **)((long)coroutine._M_fr_ptr + lVar2 + 0x840);
    plVar6 = *(long **)((long)coroutine._M_fr_ptr + lVar2 + 0x848);
    *(CapTableReader **)((long)coroutine._M_fr_ptr + lVar2 + 0x840) = __n;
    *(undefined8 *)((long)coroutine._M_fr_ptr + lVar2 + 0x848) = uVar12;
    if (plVar6 != (long *)0x0) {
      (**(code **)*puVar5)(puVar5,(long)plVar6 + *(long *)(*plVar6 + -0x10));
    }
    (**(code **)*puVar4)(puVar4,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x6a0);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6a0) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x698))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x698),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x710);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x710) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x708))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x708),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
  }
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x810) = 0;
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)((long)coroutine._M_fr_ptr + 0x6a8),
             (Client *)(*(long *)((long)coroutine._M_fr_ptr + 0x8b0) + 8),
             (Maybe<capnp::MessageSize> *)((long)coroutine._M_fr_ptr + 0x810));
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7f8) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6a8);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x800) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6b0);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x808) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6c0);
  PointerBuilder::setCapability
            ((PointerBuilder *)((long)coroutine._M_fr_ptr + 0x7f8),
             (Own<capnp::ClientHook,_std::nullptr_t> *)
             ((long)coroutine._M_fr_ptr + 0x840 +
             *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x840) + -0x18)));
  this_02 = (Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
             *)((long)coroutine._M_fr_ptr + 0x718);
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send(this_02,(int)(Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
                       *)((long)coroutine._M_fr_ptr + 0x6a8),__buf_00,(size_t)__n,__flags);
  __return_storage_ptr___00 =
       (PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *)
       ((long)coroutine._M_fr_ptr + 0x238);
  co_await<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>>
            (__return_storage_ptr___00,
             (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *)
             this_02);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x8b8) = 1;
  bVar7 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
  if (!bVar7) {
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
    ::await_resume((Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)
                   ((long)coroutine._M_fr_ptr + 0x628),__return_storage_ptr___00);
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x660);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x660) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x658))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x658),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    if ((*(char *)((long)coroutine._M_fr_ptr + 1000) == '\x01') &&
       (plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x428), plVar1 != (long *)0x0)) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x428) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x420))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x420),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      kj::Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr___00);
    lVar2 = *(long *)((long)coroutine._M_fr_ptr + 0x730);
    if (lVar2 != 0) {
      uVar12 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x738);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x730) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x738) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x740))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x740),lVar2,8,uVar12,uVar12,0);
    }
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x728);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x728) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x720))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x720),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    pSVar3 = (this_02->super_Builder)._builder.segment;
    if (pSVar3 != (SegmentBuilder *)0x0) {
      (this_02->super_Builder)._builder.segment = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar3);
    }
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x6d8);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6d8) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x6d0))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x6d0),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x850);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x850) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x848))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x848),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x8b9));
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x8b8) = 2;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> hold(HoldContext context) override {
    auto cap = context.getParams().getCap();

    // If we have a holdBouncer, bounce the capability through it first before forwarding on.
    KJ_IF_SOME(hb, holdBouncer) {
      auto req = hb.echoRequest();

      // HACK: echo() just reflects the cap back, but it was written to expect TestCallOrder
      //   specifically. We'll just pretend that's what we have, it doesn't matter.
      // TODO(cleanup): Change echo() to take `Capability` or maybe even be a generic.
      req.setCap(cap.castAs<test::TestCallOrder>());
      auto resp = co_await req.send();
      cap = resp.getCap().castAs<test::TestInterface>();
    }

    auto req = next.holdRequest();
    req.setCap(kj::mv(cap));
    co_await req.send();

    // (hold() has no results)
  }